

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

char * lws_cmdline_option(int argc,char **argv,char *val)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  sVar2 = strlen(val);
  lVar3 = (ulong)(uint)argc + 1;
  do {
    if ((int)lVar3 + -1 < 2) {
      return (char *)0x0;
    }
    pcVar4 = argv[lVar3 + -2];
    iVar1 = strncmp(pcVar4,val,sVar2);
    lVar3 = lVar3 + -1;
  } while (iVar1 != 0);
  if (((int)(uint)lVar3 < argc) && (pcVar4[sVar2] == '\0')) {
    __s = argv[(uint)lVar3 & 0x7fffffff];
    if (__s == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      sVar2 = strlen(__s);
      pcVar4 = (char *)0x0;
      if (sVar2 < 0x401) {
        pcVar4 = __s;
      }
    }
  }
  else {
    pcVar4 = pcVar4 + (pcVar4[sVar2] == '=') + sVar2;
  }
  return pcVar4;
}

Assistant:

const char *
lws_cmdline_option(int argc, const char **argv, const char *val)
{
	size_t n = strlen(val);
	int c = argc;

	while (--c > 0) {

		if (!strncmp(argv[c], val, n)) {
			if (!*(argv[c] + n) && c < argc - 1) {
				/* coverity treats unchecked argv as "tainted" */
				if (!argv[c + 1] || strlen(argv[c + 1]) > 1024)
					return NULL;
				return argv[c + 1];
			}

			if (argv[c][n] == '=')
				return &argv[c][n + 1];
			return argv[c] + n;
		}
	}

	return NULL;
}